

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symbol.cpp
# Opt level: O3

RandMode __thiscall slang::ast::Symbol::getRandMode(Symbol *this)

{
  long lVar1;
  
  if (this->kind == ClassProperty) {
    lVar1 = 0x15c;
  }
  else {
    if (this->kind != Field) {
      return None;
    }
    lVar1 = 0x164;
  }
  return *(RandMode *)((long)&this->kind + lVar1);
}

Assistant:

RandMode Symbol::getRandMode() const {
    switch (kind) {
        case SymbolKind::ClassProperty:
            return as<ClassPropertySymbol>().randMode;
        case SymbolKind::Field:
            return as<FieldSymbol>().randMode;
        default:
            return RandMode::None;
    }
}